

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_NewSymbol(JSContext *ctx,JSString *p,int atom_type)

{
  JSRuntime *pJVar1;
  JSAtom JVar2;
  int64_t iVar3;
  JSValue JVar4;
  JSValueUnion local_18;
  
  pJVar1 = ctx->rt;
  JVar2 = __JS_NewAtom(pJVar1,p,atom_type);
  if (JVar2 == 0) {
    pJVar1 = ctx->rt;
    if (pJVar1->field_0xf0 == '\0') {
      pJVar1->field_0xf0 = 1;
      JS_ThrowInternalError(ctx,"out of memory");
      pJVar1->field_0xf0 = 0;
    }
    local_18.float64 = 0.0;
    iVar3 = 6;
  }
  else {
    local_18 = (JSValueUnion)((JSValueUnion *)(pJVar1->atom_array + JVar2))->ptr;
    iVar3 = -8;
  }
  JVar4.tag = iVar3;
  JVar4.u.float64 = local_18.float64;
  return JVar4;
}

Assistant:

static JSValue JS_NewSymbol(JSContext *ctx, JSString *p, int atom_type)
{
    JSRuntime *rt = ctx->rt;
    JSAtom atom;
    atom = __JS_NewAtom(rt, p, atom_type);
    if (atom == JS_ATOM_NULL)
        return JS_ThrowOutOfMemory(ctx);
    return JS_MKPTR(JS_TAG_SYMBOL, rt->atom_array[atom]);
}